

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

string * gnuplotio::Gnuplot::get_default_cmd_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  
  __s = getenv("GNUPLOT_IOSTREAM_CMD");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(__s);
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

static std::string get_default_cmd() {
        GNUPLOT_MSVC_WARNING_4996_PUSH
        char *from_env = std::getenv("GNUPLOT_IOSTREAM_CMD");
        GNUPLOT_MSVC_WARNING_4996_POP
        if(from_env && from_env[0]) {
            return from_env;
        } else {
            return GNUPLOT_DEFAULT_COMMAND;
        }
    }